

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1a982c5::Scenario::CheckExpired(Scenario *this,NodeId peer,GenTxid gtxid)

{
  pointer *pppVar1;
  Runner *pRVar2;
  pointer pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  _Manager_type p_Var6;
  undefined8 uVar7;
  size_type __n;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar8;
  pointer ppVar9;
  anon_class_88_4_a7d767dc *in_RCX;
  anon_class_88_4_a7d767dc *__args_1;
  pointer __a;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__cur;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar10;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000000L>_> local_90;
  NodeId local_88;
  GenTxid local_80;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->m_runner;
  local_80.m_is_wtxid = gtxid.m_is_wtxid;
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[1] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[1];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[2] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[2];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[3] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[3];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[4] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[4];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[5] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[5];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[6] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[6];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[7] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[7];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[8] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[8];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[9] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[9];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[10] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[10];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_58[0] = local_48;
  pcVar3 = (this->m_testname)._M_dataplus._M_p;
  local_90.__r = (rep)pRVar2;
  local_88 = peer;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar3,pcVar3 + (this->m_testname)._M_string_length);
  __a = (pRVar2->actions).
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  if (__a == (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(&pRVar2->actions,1,"vector::_M_realloc_insert");
    ppVar4 = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__n == 0) {
      ppVar8 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)0x0;
    }
    else {
      ppVar8 = __gnu_cxx::
               new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
               ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                           *)&pRVar2->actions,__n,(void *)0x0);
    }
    __args_1 = (anon_class_88_4_a7d767dc *)((long)__a - (long)ppVar4 >> 3);
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::_lambda()_1_>
              ((allocator_type *)(&ppVar8->first + (long)__args_1),
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)(this->m_now).__r,&local_90,__args_1);
    ppVar10 = ppVar8;
    for (ppVar9 = ppVar4; ppVar9 != __a; ppVar9 = ppVar9 + 1) {
      (ppVar10->first).__r = (ppVar9->first).__r;
      *(undefined8 *)&(ppVar10->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar10->second).super__Function_base._M_functor + 8) = 0;
      (ppVar10->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar10->second)._M_invoker = (ppVar9->second)._M_invoker;
      p_Var6 = (ppVar9->second).super__Function_base._M_manager;
      if (p_Var6 != (_Manager_type)0x0) {
        uVar7 = *(undefined8 *)((long)&(ppVar9->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar10->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar9->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar10->second).super__Function_base._M_functor + 8) = uVar7;
        (ppVar10->second).super__Function_base._M_manager = p_Var6;
        (ppVar9->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar9->second)._M_invoker = (_Invoker_type)0x0;
      }
      ppVar10 = ppVar10 + 1;
    }
    for (; ppVar10 = ppVar10 + 1, ppVar5 != __a; __a = __a + 1) {
      (ppVar10->first).__r = (__a->first).__r;
      *(undefined8 *)&(ppVar10->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar10->second).super__Function_base._M_functor + 8) = 0;
      (ppVar10->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar10->second)._M_invoker = (__a->second)._M_invoker;
      p_Var6 = (__a->second).super__Function_base._M_manager;
      if (p_Var6 != (_Manager_type)0x0) {
        uVar7 = *(undefined8 *)((long)&(__a->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar10->second).super__Function_base._M_functor =
             *(undefined8 *)&(__a->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar10->second).super__Function_base._M_functor + 8) = uVar7;
        (ppVar10->second).super__Function_base._M_manager = p_Var6;
        (__a->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (__a->second)._M_invoker = (_Invoker_type)0x0;
      }
    }
    if (ppVar4 != (pointer)0x0) {
      operator_delete(ppVar4,(long)(pRVar2->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar4
                     );
    }
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar8;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar8 + __n;
  }
  else {
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::_lambda()_1_>
              ((allocator_type *)__a,
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)(this->m_now).__r,&local_90,in_RCX);
    pppVar1 = &(pRVar2->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CheckExpired(NodeId peer, GenTxid gtxid)
    {
        const auto& testname = m_testname;
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            auto it = runner.expired.find(std::pair<NodeId, GenTxid>{peer, gtxid});
            BOOST_CHECK_MESSAGE(it != runner.expired.end(), "[" + testname + "] missing expiration");
            if (it != runner.expired.end()) runner.expired.erase(it);
        });
    }